

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_relu(ActivationParams *this)

{
  bool bVar1;
  ActivationReLU *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_relu(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_relu(this);
    this_00 = (ActivationReLU *)operator_new(0x18);
    ActivationReLU::ActivationReLU(this_00);
    (this->NonlinearityType_).relu_ = this_00;
  }
  return (ActivationReLU *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationReLU* ActivationParams::mutable_relu() {
  if (!has_relu()) {
    clear_NonlinearityType();
    set_has_relu();
    NonlinearityType_.relu_ = new ::CoreML::Specification::ActivationReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.ReLU)
  return NonlinearityType_.relu_;
}